

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

bool __thiscall Cache::policyValid(Cache *this)

{
  long in_RDI;
  bool local_1;
  
  if ((*(uint *)(in_RDI + 0x30) & *(int *)(in_RDI + 0x30) - 1U) == 0) {
    if ((*(uint *)(in_RDI + 0x34) & *(int *)(in_RDI + 0x34) - 1U) == 0) {
      if (*(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x34) == *(int *)(in_RDI + 0x30)) {
        if (*(uint *)(in_RDI + 0x38) % *(uint *)(in_RDI + 0x3c) == 0) {
          local_1 = true;
        }
        else {
          fprintf(_stderr,"block_num %% associativity != 0\n");
          local_1 = false;
        }
      }
      else {
        fprintf(_stderr,"block_num * block_size != cache_size\n");
        local_1 = false;
      }
    }
    else {
      fprintf(_stderr,"Block Size Invalid: %d\n",(ulong)*(uint *)(in_RDI + 0x34));
      local_1 = false;
    }
  }
  else {
    fprintf(_stderr,"Cache Size Invalid: %d\n",(ulong)*(uint *)(in_RDI + 0x30));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Cache::policyValid() const {
    if (!(is_pow(policy.cache_size))) {
        fprintf(stderr, "Cache Size Invalid: %d\n", policy.cache_size);
        return false;
    }
    if (!(is_pow(policy.block_size))) {
        fprintf(stderr, "Block Size Invalid: %d\n", policy.block_size);
        return false;
    }
    if (policy.block_num * policy.block_size != policy.cache_size) {
        fprintf(stderr, "block_num * block_size != cache_size\n");
        return false;
    }
    if (policy.block_num % policy.associativity != 0) {
        fprintf(stderr, "block_num %% associativity != 0\n");
        return false;
    }
    return true;
}